

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp.c
# Opt level: O2

int lejp_parse(lejp_ctx *ctx,uchar *json,int len)

{
  byte *pbVar1;
  undefined2 uVar2;
  long lVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  ushort uVar12;
  uint uVar13;
  ulong uVar15;
  uint8_t uVar16;
  long lVar17;
  int iVar18;
  uint8_t *puVar19;
  byte *pbVar20;
  int iVar21;
  char cStack_50;
  uint uVar14;
  
  if ((ctx->sp == '\0') && (ctx->pst[ctx->pst_sp].ppos == '\0')) {
    (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x02');
  }
switchD_001386e0_caseD_49:
  do {
    iVar21 = len;
    pbVar20 = json;
    iVar18 = iVar21 + -1;
    if (iVar21 == 0) {
      return -1;
    }
    pbVar1 = pbVar20 + 1;
    bVar11 = *pbVar20;
    uVar15 = (ulong)bVar11;
    bVar5 = ctx->sp;
    uVar9 = (ulong)bVar5;
    bVar6 = ctx->st[uVar9].s;
    bVar10 = bVar6;
    json = pbVar1;
    len = iVar18;
    if (uVar15 < 0x24) {
      if ((0x900002200U >> (uVar15 & 0x3f) & 1) == 0) {
        if (uVar15 != 10) goto LAB_001386ae;
        ctx->line = ctx->line + 1;
        bVar10 = bVar6 & 0xdf;
        ctx->st[uVar9].s = bVar10;
      }
      if ((bVar6 & 0x40) == 0) {
        if (bVar11 == 0x23) {
          ctx->st[uVar9].s = bVar10 | 0x20;
        }
        goto switchD_001386e0_caseD_49;
      }
    }
LAB_001386ae:
  } while ((bVar10 & 0x20) != 0);
  uVar13 = (uint)bVar11;
  uVar14 = (uint)bVar11;
  uVar8 = (uint)bVar5;
  switch(bVar6) {
  case 0x43:
    if (uVar13 == 0x5c) {
      ctx->st[uVar9].s = 'D';
      goto switchD_001386e0_caseD_49;
    }
    if (uVar13 == 0x22) {
      if (bVar5 == 0) {
        iVar21 = 0xfb;
        goto LAB_00139457;
      }
      if (ctx->st[uVar8 - 1].s != '\t') {
        ctx->buf[ctx->npos] = '\0';
        cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'M');
        if (cVar7 < '\0') goto LAB_0013933a;
        bVar5 = ctx->sp;
      }
      ctx->sp = bVar5 - 1;
      goto switchD_001386e0_caseD_49;
    }
    if (bVar11 < 0x20) {
      iVar21 = 0xfa;
      goto LAB_00139457;
    }
    break;
  case 0x44:
    if (bVar11 == 0x75) {
      ctx->st[uVar9].s = 'E';
      ctx->uni = 0;
      goto switchD_001386e0_caseD_49;
    }
    lVar3 = 0;
    do {
      lVar17 = lVar3;
      if (lVar17 == 9) {
        iVar21 = 0xf9;
        goto LAB_00139457;
      }
      lVar3 = lVar17 + 1;
    } while (uVar14 != (int)"\"\\/bfnrt"[lVar17]);
    bVar11 = "\"\\/\b\f\n\r\t"[lVar17];
    ctx->st[uVar9].s = 'C';
    break;
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
    uVar2 = ctx->uni;
    ctx->uni = uVar2 * 0x10;
    uVar12 = (ushort)bVar11;
    if ((byte)(bVar11 - 0x30) < 10) {
      uVar12 = (uVar12 + uVar2 * 0x10) - 0x30;
    }
    else if ((byte)(bVar11 + 0x9f) < 6) {
      uVar12 = uVar12 - 0x57;
    }
    else {
      if (5 < (byte)(bVar11 + 0xbf)) {
        iVar21 = 0xf8;
        goto LAB_00139457;
      }
      uVar12 = uVar12 - 0x37;
    }
    ctx->uni = uVar12;
    ctx->st[uVar9].s = bVar10 + 1;
    bVar10 = (byte)uVar12;
    if (bVar6 == 0x48) {
      bVar11 = bVar10 & 0x3f | 0x80;
      if (uVar12 < 0x80) {
        bVar11 = bVar10;
      }
      ctx->st[uVar9].s = 'C';
    }
    else if (bVar6 == 0x47) {
      if (uVar12 < 0x80) {
        if (uVar12 < 8) goto switchD_001386e0_caseD_49;
        bVar11 = bVar10 >> 2 | 0xc0;
      }
      else {
        bVar11 = bVar10 >> 2 | 0x80;
      }
    }
    else {
      if ((bVar6 != 0x46) || (uVar12 < 8)) goto switchD_001386e0_caseD_49;
      bVar11 = bVar10 >> 4 | 0xe0;
    }
    break;
  case 0x49:
  case 0x4a:
    goto switchD_001386e0_caseD_49;
  case 0x4b:
    if (bVar11 == 0x2d && ctx->npos == 0) {
      ctx->f = ctx->f | 1;
    }
    else {
      bVar5 = ctx->dcount;
      if (9 < (byte)(bVar11 - 0x30) || 0x13 < bVar5) {
        if (bVar11 == 0x2e) {
          iVar21 = 0xf4;
          if ((bVar5 != 0) && ((ctx->f & 2) == 0)) {
            ctx->f = ctx->f | 2;
            goto LAB_00138e75;
          }
          goto LAB_00139457;
        }
        bVar6 = ctx->f;
        if ((bVar6 & 6) == 2) {
          iVar21 = 0xf5;
          goto LAB_00139457;
        }
        if ((bVar11 & 0xdf) == 0x45) {
          if ((bVar6 & 8) == 0) {
            ctx->f = bVar6 | 8;
            ctx->st[uVar9].s = 'L';
            goto LAB_00138e75;
          }
        }
        else if (bVar5 != 0) {
          ctx->buf[ctx->npos] = '\0';
          if ((bVar6 & 2) == 0) {
            cStack_50 = 'I';
          }
          else {
            cStack_50 = 'J';
          }
          cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,cStack_50);
          if (cVar7 != '\0') goto LAB_0013933a;
          ctx->st[ctx->sp].s = '\x0e';
          json = pbVar20;
          len = iVar21;
          goto switchD_001386e0_caseD_49;
        }
        iVar21 = 0xf4;
        goto LAB_00139457;
      }
      if ((ctx->f & 2) != 0) {
        ctx->f = ctx->f | 4;
      }
      ctx->dcount = bVar5 + 1;
    }
    goto LAB_00138e75;
  case 0x4c:
    ctx->st[uVar9].s = 'K';
    json = pbVar20;
    len = iVar21;
    if ((byte)(bVar11 - 0x30) < 10) goto switchD_001386e0_caseD_49;
    if ((uVar13 != 0x2b) && (uVar14 != 0x2d)) {
      iVar21 = 0xf3;
      goto LAB_00139457;
    }
LAB_00138e75:
    bVar5 = ctx->npos;
    if ((ulong)bVar5 == 0xff) {
      iVar21 = 0xec;
      goto LAB_00139457;
    }
    ctx->npos = bVar5 + 1;
    ctx->buf[bVar5] = bVar11;
    json = pbVar1;
    len = iVar18;
    goto switchD_001386e0_caseD_49;
  case 0x4d:
    uVar12 = ctx->uni;
    if (uVar13 != (int)"rue alse ull "[uVar12]) {
      iVar21 = 0xf2;
      goto LAB_00139457;
    }
    ctx->uni = (uint16_t)(uVar12 + 1);
    if ((0x1108UL >> ((ulong)(uVar12 + 1) & 0x3f) & 1) != 0) {
      if (uVar12 == 0xb) {
        ctx->buf[0] = '\0';
        cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'H');
joined_r0x0013920d:
        if (cVar7 != '\0') goto LAB_0013933a;
      }
      else {
        if (uVar12 == 7) {
          ctx->buf[0] = '0';
          ctx->buf[1] = '\0';
          bVar5 = ctx->pst_sp;
          cStack_50 = 'G';
LAB_001391d3:
          cVar7 = (*ctx->pst[bVar5].callback)(ctx,cStack_50);
          goto joined_r0x0013920d;
        }
        if (uVar12 == 2) {
          ctx->buf[0] = '1';
          ctx->buf[1] = '\0';
          bVar5 = ctx->pst_sp;
          cStack_50 = 'F';
          goto LAB_001391d3;
        }
      }
      ctx->st[ctx->sp].s = '\x0e';
    }
    goto switchD_001386e0_caseD_49;
  default:
    switch(bVar6) {
    case 0:
      if (bVar11 != 0x7b) {
        iVar21 = 0xfe;
        goto LAB_00139457;
      }
      cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x10');
      if (cVar7 != '\0') goto LAB_0013933a;
      ctx->st[ctx->sp].s = '\x01';
      goto switchD_001386e0_caseD_49;
    case 1:
      if (bVar11 == 0x7d) {
        ctx->st[uVar9].s = '\0';
        iVar21 = 0xfd;
        goto LAB_00139457;
      }
      ctx->st[uVar9].s = '\x02';
      json = pbVar20;
      len = iVar21;
      goto switchD_001386e0_caseD_49;
    case 2:
      if (bVar11 != 0x22) {
        iVar21 = 0xfc;
        goto LAB_00139457;
      }
      ctx->st[uVar9].s = '\t';
      cVar7 = 'C';
      break;
    default:
      goto switchD_001386e0_caseD_49;
    case 9:
      if (bVar11 == 0x3a) {
        ctx->st[uVar9].s = '\n';
        ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
        lejp_check_path_match(ctx);
        cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x05');
        goto joined_r0x00138f81;
      }
      iVar21 = 0xf7;
      goto LAB_00139457;
    case 10:
      if ((byte)(bVar11 - 0x30) < 10) {
        ctx->npos = '\0';
        ctx->dcount = '\0';
        ctx->f = '\0';
        ctx->st[uVar9].s = 'K';
        json = pbVar20;
        len = iVar21;
        goto switchD_001386e0_caseD_49;
      }
      if (uVar13 == 0x7b) {
        ctx->st[uVar9].s = '\x0e';
        lejp_check_path_match(ctx);
        cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x10');
        if (cVar7 != '\0') {
LAB_0013933a:
          iVar21 = 0xe9;
LAB_00139457:
          (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x04');
          return iVar21;
        }
        ctx->path_match = '\0';
        cVar7 = '\x01';
      }
      else {
        if (uVar14 != 0x5b) {
          if (uVar14 == 0x5d) {
            if (bVar5 == 0) goto LAB_001393b0;
            bVar5 = bVar5 - 1;
            ctx->sp = bVar5;
            uVar9 = (ulong)bVar5;
            if (ctx->st[uVar9].s != '\x0f') goto LAB_001393bb;
            bVar6 = ctx->pst_sp;
            if (uVar9 == 0) {
              bVar5 = ctx->pst[bVar6].ppos;
            }
            else {
              bVar5 = ctx->st[bVar5 - 1].p;
              ctx->pst[bVar6].ppos = bVar5;
              ctx->ipos = ctx->st[uVar9 - 1].i;
            }
            ctx->path[bVar5] = '\0';
            bVar5 = ctx->pst[bVar6].ppos;
            if ((ctx->path_match != '\0') && (bVar5 <= ctx->path_match_len)) {
              ctx->path_match = '\0';
            }
            ctx->path[bVar5] = '\0';
            goto LAB_0013919f;
          }
          if (uVar14 == 0x66) {
            ctx->uni = 4;
          }
          else if (uVar14 == 0x6e) {
            ctx->uni = 9;
          }
          else {
            if (uVar13 != 0x74) {
              if (uVar13 != 0x22) {
                iVar21 = 0xf6;
                goto LAB_00139457;
              }
              ctx->st[uVar9].s = '\x0e';
              ctx->npos = '\0';
              ctx->buf[0] = '\0';
              cVar4 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\v');
              cVar7 = 'C';
              if (cVar4 == '\0') break;
              goto LAB_0013933a;
            }
            ctx->uni = 0;
          }
          ctx->st[uVar9].s = 'M';
          goto switchD_001386e0_caseD_49;
        }
        ctx->st[uVar9].s = '\x0f';
        bVar5 = ctx->pst_sp;
        bVar6 = ctx->pst[bVar5].ppos;
        ctx->pst[bVar5].ppos = bVar6 + 1;
        ctx->path[bVar6] = '[';
        bVar6 = ctx->pst[bVar5].ppos;
        ctx->pst[bVar5].ppos = bVar6 + 1;
        ctx->path[bVar6] = ']';
        ctx->path[ctx->pst[bVar5].ppos] = '\0';
        cVar7 = (*ctx->pst[bVar5].callback)(ctx,'\x0e');
        if (cVar7 != '\0') goto LAB_0013933a;
        bVar5 = ctx->ipos;
        bVar6 = bVar5 + 1;
        ctx->ipos = bVar6;
        ctx->i[bVar5] = 0;
        cVar7 = '\n';
        if (5 < bVar6) {
          iVar21 = 0xed;
          goto LAB_00139457;
        }
      }
      break;
    case 0xe:
      puVar19 = &ctx->pst[ctx->pst_sp].ppos;
      ctx->path[*puVar19] = '\0';
      if (uVar13 == 0x7d) {
        if (bVar5 == 0) {
          lejp_check_path_match(ctx);
          cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x11');
          iVar21 = 0xe9;
          if (cVar7 == '\0') {
            cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x03');
            iVar21 = 0xea;
            if (cVar7 == '\0') {
              return iVar18;
            }
          }
          goto LAB_00139457;
        }
        bVar5 = bVar5 - 1;
        ctx->sp = bVar5;
        if (bVar5 == 0) {
          bVar6 = *puVar19;
        }
        else {
          bVar6 = ctx->st[bVar5].p;
          *puVar19 = bVar6;
          ctx->ipos = ctx->st[bVar5].i;
        }
        ctx->path[bVar6] = '\0';
        if ((ctx->path_match != '\0') && (*puVar19 <= ctx->path_match_len)) {
          ctx->path_match = '\0';
        }
        lejp_check_path_match(ctx);
        cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x11');
joined_r0x00138f81:
        if (cVar7 != '\0') goto LAB_0013933a;
      }
      else if (uVar13 == 0x5d) {
        if (bVar5 == 0) {
LAB_001393b0:
          iVar21 = 0xf1;
          goto LAB_00139457;
        }
        bVar5 = bVar5 - 1;
        ctx->sp = bVar5;
        uVar9 = (ulong)bVar5;
        if (ctx->st[uVar9].s != '\x0f') {
LAB_001393bb:
          iVar21 = 0xf0;
          goto LAB_00139457;
        }
        if (uVar9 == 0) {
          bVar5 = *puVar19;
        }
        else {
          bVar5 = ctx->st[bVar5 - 1].p;
          *puVar19 = bVar5;
          ctx->ipos = ctx->st[uVar9 - 1].i;
        }
        ctx->path[bVar5] = '\0';
        json = pbVar20;
        len = iVar21;
        if ((ctx->path_match != '\0') && (*puVar19 <= ctx->path_match_len)) {
          ctx->path_match = '\0';
        }
      }
      else {
        if (uVar13 != 0x2c) {
          iVar21 = 0xeb;
          goto LAB_00139457;
        }
        ctx->st[uVar9].s = '\x02';
        if (bVar5 == 0) {
          *puVar19 = '\0';
          ctx->path_match = '\0';
        }
        else {
          bVar5 = ctx->st[uVar8 - 1].p;
          *puVar19 = bVar5;
          ctx->path[bVar5] = '\0';
          if ((ctx->path_match != '\0') && (*puVar19 <= ctx->path_match_len)) {
            ctx->path_match = '\0';
          }
          if (ctx->st[uVar9 - 1].s == '\x0f') {
            if (ctx->ipos != 0) {
              ctx->i[ctx->ipos - 1] = ctx->i[ctx->ipos - 1] + 1;
            }
            ctx->st[uVar9].s = '\n';
          }
        }
      }
      goto switchD_001386e0_caseD_49;
    case 0xf:
      bVar6 = ctx->pst_sp;
      ctx->path[ctx->pst[bVar6].ppos] = '\0';
      if (uVar13 == 0x5d) {
LAB_0013919f:
        ctx->st[uVar9].s = '\x0e';
        (*ctx->pst[bVar6].callback)(ctx,'\x0f');
      }
      else {
        if (uVar13 != 0x2c) {
          iVar21 = 0xef;
          goto LAB_00139457;
        }
        if (ctx->ipos != 0) {
          ctx->i[ctx->ipos - 1] = ctx->i[ctx->ipos - 1] + 1;
        }
        puVar19 = &ctx->pst[bVar6].ppos;
        ctx->st[uVar9].s = '\n';
        if (bVar5 == 0) {
          bVar5 = *puVar19;
        }
        else {
          bVar5 = ctx->st[uVar8 - 1].p;
          *puVar19 = bVar5;
        }
        ctx->path[bVar5] = '\0';
      }
      goto switchD_001386e0_caseD_49;
    }
    bVar5 = ctx->pst[ctx->pst_sp].ppos;
    uVar9 = (ulong)bVar5;
    bVar6 = ctx->sp;
    if (uVar9 == 0) {
      uVar9 = 0;
    }
    else if ((ctx->st[bVar6].s & 0xfeU) != 0xe) {
      puVar19 = &ctx->pst[ctx->pst_sp].ppos;
      *puVar19 = bVar5 + 1;
      ctx->path[uVar9] = '.';
      uVar9 = (ulong)*puVar19;
    }
    ctx->st[bVar6].p = (char)uVar9;
    ctx->st[bVar6].i = ctx->ipos;
    bVar6 = bVar6 + 1;
    ctx->sp = bVar6;
    if (bVar6 == 0xc) {
      iVar21 = 0xee;
      goto LAB_00139457;
    }
    ctx->path[uVar9] = '\0';
    ctx->st[bVar6].s = cVar7;
    ctx->st[bVar6].b = '\0';
    goto switchD_001386e0_caseD_49;
  }
  if ((bVar5 == 0) || (ctx->st[uVar8 - 1].s != '\t')) {
    bVar5 = ctx->npos;
    uVar16 = bVar5 + 1;
    ctx->npos = uVar16;
    ctx->buf[bVar5] = bVar11;
    if (uVar16 == 0xfe) {
      cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'L');
      if (cVar7 != '\0') goto LAB_0013933a;
      ctx->npos = '\0';
    }
  }
  else {
    bVar5 = ctx->pst[ctx->pst_sp].ppos;
    ctx->pst[ctx->pst_sp].ppos = bVar5 + 1;
    ctx->path[bVar5] = bVar11;
  }
  goto switchD_001386e0_caseD_49;
}

Assistant:

int
lejp_parse(struct lejp_ctx *ctx, const unsigned char *json, int len)
{
	unsigned char c, n, s, ret = LEJP_REJECT_UNKNOWN;
	static const char esc_char[] = "\"\\/bfnrt";
	static const char esc_tran[] = "\"\\/\b\f\n\r\t";
	static const char tokens[] = "rue alse ull ";

	if (!ctx->sp && !ctx->pst[ctx->pst_sp].ppos)
		ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_START);

	while (len--) {
		c = *json++;
		s = ctx->st[ctx->sp].s;

		/* skip whitespace unless we should care */
		if (c == ' ' || c == '\t' || c == '\n' || c == '\r' || c == '#') {
			if (c == '\n') {
				ctx->line++;
				ctx->st[ctx->sp].s &= ~LEJP_FLAG_WS_COMMENTLINE;
			}
			if (!(s & LEJP_FLAG_WS_KEEP)) {
				if (c == '#')
					ctx->st[ctx->sp].s |=
						LEJP_FLAG_WS_COMMENTLINE;
				continue;
			}
		}

		if (ctx->st[ctx->sp].s & LEJP_FLAG_WS_COMMENTLINE)
			continue;

		switch (s) {
		case LEJP_IDLE:
			if (c != '{') {
				ret = LEJP_REJECT_IDLE_NO_BRACE;
				goto reject;
			}
			if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_OBJECT_START)) {
				ret = LEJP_REJECT_CALLBACK;
				goto reject;
			}
			ctx->st[ctx->sp].s = LEJP_MEMBERS;
			break;
		case LEJP_MEMBERS:
			if (c == '}') {
				ctx->st[ctx->sp].s = LEJP_IDLE;
				ret = LEJP_REJECT_MEMBERS_NO_CLOSE;
				goto reject;
			}
			ctx->st[ctx->sp].s = LEJP_M_P;
			goto redo_character;
		case LEJP_M_P:
			if (c != '\"') {
				ret = LEJP_REJECT_MP_NO_OPEN_QUOTE;
				goto reject;
			}
			/* push */
			ctx->st[ctx->sp].s = LEJP_MP_DELIM;
			c = LEJP_MP_STRING;
			goto add_stack_level;

		case LEJP_MP_STRING:
			if (c == '\"') {
				if (!ctx->sp) { /* JSON can't end on quote */
					ret = LEJP_REJECT_MP_STRING_UNDERRUN;
					goto reject;
				}
				if (ctx->st[ctx->sp - 1].s != LEJP_MP_DELIM) {
					ctx->buf[ctx->npos] = '\0';
					if (ctx->pst[ctx->pst_sp].callback(ctx,
						      LEJPCB_VAL_STR_END) < 0) {
						ret = LEJP_REJECT_CALLBACK;
						goto reject;
					}
				}
				/* pop */
				ctx->sp--;
				break;
			}
			if (c == '\\') {
				ctx->st[ctx->sp].s = LEJP_MP_STRING_ESC;
				break;
			}
			if (c < ' ') {/* "control characters" not allowed */
				ret = LEJP_REJECT_MP_ILLEGAL_CTRL;
				goto reject;
			}
			goto emit_string_char;

		case LEJP_MP_STRING_ESC:
			if (c == 'u') {
				ctx->st[ctx->sp].s = LEJP_MP_STRING_ESC_U1;
				ctx->uni = 0;
				break;
			}
			for (n = 0; n < sizeof(esc_char); n++) {
				if (c != esc_char[n])
					continue;
				/* found it */
				c = esc_tran[n];
				ctx->st[ctx->sp].s = LEJP_MP_STRING;
				goto emit_string_char;
			}
			ret = LEJP_REJECT_MP_STRING_ESC_ILLEGAL_ESC;
			/* illegal escape char */
			goto reject;

		case LEJP_MP_STRING_ESC_U1:
		case LEJP_MP_STRING_ESC_U2:
		case LEJP_MP_STRING_ESC_U3:
		case LEJP_MP_STRING_ESC_U4:
			ctx->uni <<= 4;
			if (c >= '0' && c <= '9')
				ctx->uni |= c - '0';
			else
				if (c >= 'a' && c <= 'f')
					ctx->uni = c - 'a' + 10;
				else
					if (c >= 'A' && c <= 'F')
						ctx->uni = c - 'A' + 10;
					else {
						ret = LEJP_REJECT_ILLEGAL_HEX;
						goto reject;
					}
			ctx->st[ctx->sp].s++;
			switch (s) {
			case LEJP_MP_STRING_ESC_U2:
				if (ctx->uni < 0x08)
					break;
				/*
				 * 0x08-0xff (0x0800 - 0xffff)
				 * emit 3-byte UTF-8
				 */
				c = 0xe0 | ((ctx->uni >> 4) & 0xf);
				goto emit_string_char;

			case LEJP_MP_STRING_ESC_U3:
				if (ctx->uni >= 0x080) {
					/*
					 * 0x080 - 0xfff (0x0800 - 0xffff)
					 * middle 3-byte seq
					 * send ....XXXXXX..
					 */
					c = 0x80 | ((ctx->uni >> 2) & 0x3f);
					goto emit_string_char;
				}
				if (ctx->uni < 0x008)
					break;
				/*
				 * 0x008 - 0x7f (0x0080 - 0x07ff)
				 * start 2-byte seq
				 */
				c = 0xc0 | (ctx->uni >> 2);
				goto emit_string_char;

			case LEJP_MP_STRING_ESC_U4:
				if (ctx->uni >= 0x0080)
					/* end of 2 or 3-byte seq */
					c = 0x80 | (ctx->uni & 0x3f);
				else
					/* literal */
					c = (unsigned char)ctx->uni;

				ctx->st[ctx->sp].s = LEJP_MP_STRING;
				goto emit_string_char;
			default:
				break;
			}
			break;

		case LEJP_MP_DELIM:
			if (c != ':') {
				ret = LEJP_REJECT_MP_DELIM_MISSING_COLON;
				goto reject;
			}
			ctx->st[ctx->sp].s = LEJP_MP_VALUE;
			ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';

			lejp_check_path_match(ctx);
			if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_PAIR_NAME)) {
				ret = LEJP_REJECT_CALLBACK;
				goto reject;
			}
			break;

		case LEJP_MP_VALUE:
			if (c >= '0' && c <= '9') {
				ctx->npos = 0;
				ctx->dcount = 0;
				ctx->f = 0;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_NUM_INT;
				goto redo_character;
			}
			switch (c) {
			case'\"':
				/* push */
				ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
				c = LEJP_MP_STRING;
				ctx->npos = 0;
				ctx->buf[0] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_STR_START)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				goto add_stack_level;

			case '{':
				/* push */
				ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
				c = LEJP_MEMBERS;
				lejp_check_path_match(ctx);
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_OBJECT_START)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				ctx->path_match = 0;
				goto add_stack_level;

			case '[':
				/* push */
				ctx->st[ctx->sp].s = LEJP_MP_ARRAY_END;
				c = LEJP_MP_VALUE;
				ctx->path[ctx->pst[ctx->pst_sp].ppos++] = '[';
				ctx->path[ctx->pst[ctx->pst_sp].ppos++] = ']';
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_ARRAY_START)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				ctx->i[ctx->ipos++] = 0;
				if (ctx->ipos > LWS_ARRAY_SIZE(ctx->i)) {
					ret = LEJP_REJECT_MP_DELIM_ISTACK;
					goto reject;
				}
				goto add_stack_level;

			case ']':
				/* pop */
				if (!ctx->sp) { /* JSON can't end on ] */
					ret = LEJP_REJECT_MP_C_OR_E_UNDERF;
					goto reject;
				}
				ctx->sp--;
				if (ctx->st[ctx->sp].s != LEJP_MP_ARRAY_END) {
					ret = LEJP_REJECT_MP_C_OR_E_NOTARRAY;
					goto reject;
				}
				/* drop the path [n] bit */
				if (ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
					ctx->ipos = ctx->st[ctx->sp - 1].i;
				}
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
				    ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;
				goto array_end;

			case 't': /* true */
				ctx->uni = 0;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_TOK;
				break;

			case 'f':
				ctx->uni = 4;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_TOK;
				break;

			case 'n':
				ctx->uni = 4 + 5;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_TOK;
				break;
			default:
				ret = LEJP_REJECT_MP_DELIM_BAD_VALUE_START;
				goto reject;
			}
			break;

		case LEJP_MP_VALUE_NUM_INT:
			if (!ctx->npos && c == '-') {
				ctx->f |= LEJP_SEEN_MINUS;
				goto append_npos;
			}

			if (ctx->dcount < 20 && c >= '0' && c <= '9') {
				if (ctx->f & LEJP_SEEN_POINT)
					ctx->f |= LEJP_SEEN_POST_POINT;
				ctx->dcount++;
				goto append_npos;
			}
			if (c == '.') {
				if (!ctx->dcount || (ctx->f & LEJP_SEEN_POINT)) {
					ret = LEJP_REJECT_MP_VAL_NUM_FORMAT;
					goto reject;
				}
				ctx->f |= LEJP_SEEN_POINT;
				goto append_npos;
			}
			/*
			 * before exponent, if we had . we must have had at
			 * least one more digit
			 */
			if ((ctx->f &
				(LEJP_SEEN_POINT | LEJP_SEEN_POST_POINT)) ==
							      LEJP_SEEN_POINT) {
				ret = LEJP_REJECT_MP_VAL_NUM_INT_NO_FRAC;
				goto reject;
			}
			if (c == 'e' || c == 'E') {
				if (ctx->f & LEJP_SEEN_EXP) {
					ret = LEJP_REJECT_MP_VAL_NUM_FORMAT;
					goto reject;
				}
				ctx->f |= LEJP_SEEN_EXP;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_NUM_EXP;
				goto append_npos;
			}
			/* if none of the above, did we even have a number? */
			if (!ctx->dcount) {
				ret = LEJP_REJECT_MP_VAL_NUM_FORMAT;
				goto reject;
			}

			ctx->buf[ctx->npos] = '\0';
			if (ctx->f & LEJP_SEEN_POINT) {
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_NUM_FLOAT)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
			} else {
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_NUM_INT)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
			}

			/* then this is the post-number character, loop */
			ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
			goto redo_character;

		case LEJP_MP_VALUE_NUM_EXP:
			ctx->st[ctx->sp].s = LEJP_MP_VALUE_NUM_INT;
			if (c >= '0' && c <= '9')
				goto redo_character;
			if (c == '+' || c == '-')
				goto append_npos;
			ret = LEJP_REJECT_MP_VAL_NUM_EXP_BAD_EXP;
			goto reject;

		case LEJP_MP_VALUE_TOK: /* true, false, null */
			if (c != tokens[ctx->uni]) {
				ret = LEJP_REJECT_MP_VAL_TOK_UNKNOWN;
				goto reject;
			}
			ctx->uni++;
			if (tokens[ctx->uni] != ' ')
				break;
			switch (ctx->uni) {
			case 3:
				ctx->buf[0] = '1';
				ctx->buf[1] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_TRUE)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			case 8:
				ctx->buf[0] = '0';
				ctx->buf[1] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_FALSE)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			case 12:
				ctx->buf[0] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_NULL)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			}
			ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
			break;

		case LEJP_MP_COMMA_OR_END:
			ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
			if (c == ',') {
				/* increment this stack level's index */
				ctx->st[ctx->sp].s = LEJP_M_P;
				if (!ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos = 0;
					/*
					 * since we came back to root level,
					 * no path can still match
					 */
					ctx->path_match = 0;
					break;
				}
				ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
						ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;

				if (ctx->st[ctx->sp - 1].s != LEJP_MP_ARRAY_END)
					break;
				/* top level is definitely an array... */
				if (ctx->ipos)
					ctx->i[ctx->ipos - 1]++;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE;
				break;
			}
			if (c == ']') {
				if (!ctx->sp) {  /* JSON can't end on ] */
					ret = LEJP_REJECT_MP_C_OR_E_UNDERF;
					goto reject;
				}
				/* pop */
				ctx->sp--;
				if (ctx->st[ctx->sp].s != LEJP_MP_ARRAY_END) {
					ret = LEJP_REJECT_MP_C_OR_E_NOTARRAY;
					goto reject;
				}
				/* drop the path [n] bit */
				if (ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
					ctx->ipos = ctx->st[ctx->sp - 1].i;
				}
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
						ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;

				/* do LEJP_MP_ARRAY_END processing */
				goto redo_character;
			}
			if (c == '}') {
				if (!ctx->sp) {
					lejp_check_path_match(ctx);
					if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_OBJECT_END)) {
						ret = LEJP_REJECT_CALLBACK;
						goto reject;
					}
					if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_COMPLETE))
						goto reject;
					else
						/* done, return unused amount */
						return len;
				}

				/* pop */

				ctx->sp--;
				if (ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos =
							ctx->st[ctx->sp].p;
					ctx->ipos = ctx->st[ctx->sp].i;
				}
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
				    ctx->pst[ctx->pst_sp].ppos <=
						    ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;

				lejp_check_path_match(ctx);
				if (ctx->pst[ctx->pst_sp].callback(ctx,
							LEJPCB_OBJECT_END)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			}

			ret = LEJP_REJECT_MP_C_OR_E_NEITHER;
			goto reject;

		case LEJP_MP_ARRAY_END:
array_end:
			ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
			if (c == ',') {
				/* increment this stack level's index */
				if (ctx->ipos)
					ctx->i[ctx->ipos - 1]++;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE;
				if (ctx->sp)
					ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				break;
			}
			if (c != ']') {
				ret = LEJP_REJECT_MP_ARRAY_END_MISSING;
				goto reject;
			}

			ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
			ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_ARRAY_END);
			break;
		}

		continue;

emit_string_char:
		if (!ctx->sp || ctx->st[ctx->sp - 1].s != LEJP_MP_DELIM) {
			/* assemble the string value into chunks */
			ctx->buf[ctx->npos++] = c;
			if (ctx->npos == sizeof(ctx->buf) - 1) {
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_STR_CHUNK)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				ctx->npos = 0;
			}
			continue;
		}
		/* name part of name:value pair */
		ctx->path[ctx->pst[ctx->pst_sp].ppos++] = c;
		continue;

add_stack_level:
		/* push on to the object stack */
		if (ctx->pst[ctx->pst_sp].ppos &&
		    ctx->st[ctx->sp].s != LEJP_MP_COMMA_OR_END &&
		    ctx->st[ctx->sp].s != LEJP_MP_ARRAY_END)
			ctx->path[ctx->pst[ctx->pst_sp].ppos++] = '.';

		ctx->st[ctx->sp].p = ctx->pst[ctx->pst_sp].ppos;
		ctx->st[ctx->sp].i = ctx->ipos;
		if (++ctx->sp == LWS_ARRAY_SIZE(ctx->st)) {
			ret = LEJP_REJECT_STACK_OVERFLOW;
			goto reject;
		}
		ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
		ctx->st[ctx->sp].s = c;
		ctx->st[ctx->sp].b = 0;
		continue;

append_npos:
		if (ctx->npos >= sizeof(ctx->buf)) {
			ret = LEJP_REJECT_NUM_TOO_LONG;
			goto reject;
		}
		ctx->buf[ctx->npos++] = c;
		continue;

redo_character:
		json--;
		len++;
	}

	return LEJP_CONTINUE;

reject:
	ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_FAILED);
	return ret;
}